

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

StringTree * __thiscall
kj::strTree<char_const(&)[31],capnp::Text::Reader,char_const(&)[6]>
          (StringTree *__return_storage_ptr__,kj *this,char (*params) [31],Reader *params_1,
          char (*params_2) [6])

{
  char (*value) [31];
  Reader *value_00;
  char (*value_01) [6];
  ArrayPtr<const_char> local_58;
  ArrayPtr<const_char> local_48;
  ArrayPtr<const_char> local_38;
  Reader *local_28;
  char (*params_local_2) [6];
  Reader *params_local_1;
  char (*params_local) [31];
  
  local_28 = params_1;
  params_local_2 = (char (*) [6])params;
  params_local_1 = (Reader *)this;
  params_local = (char (*) [31])__return_storage_ptr__;
  value = ::const((char (*) [31])this);
  local_38 = _::toStringTreeOrCharSequence<char_const(&)[31]>(value);
  value_00 = fwd<capnp::Text::Reader>((NoInfer<capnp::Text::Reader> *)params_local_2);
  local_48 = _::toStringTreeOrCharSequence<capnp::Text::Reader>(value_00);
  value_01 = ::const((char (*) [6])local_28);
  local_58 = _::toStringTreeOrCharSequence<char_const(&)[6]>(value_01);
  StringTree::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(StringTree *)&local_38,&local_48,&local_58,
             (ArrayPtr<const_char> *)params_2);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}